

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_kinematics_animated(xr_ogf_v3 *this,xr_reader *r)

{
  bool bVar1;
  xr_reader *pxVar2;
  xr_reader *s;
  
  load_kinematics(this,r);
  s = xr_reader::open_chunk(r,0x1d);
  if (s != (xr_reader *)0x0) {
    load_s_motion_refs(this,s);
    goto LAB_0016ec80;
  }
  pxVar2 = xr_reader::open_chunk(r,0x14);
  s = pxVar2;
  if (pxVar2 == (xr_reader *)0x0) {
    pxVar2 = xr_reader::open_chunk(r,0x12);
    s = pxVar2;
    if (pxVar2 != (xr_reader *)0x0) {
      load_s_smparams(this,pxVar2);
      bVar1 = xr_reader::eof(pxVar2);
      if (!bVar1) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x3b2,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
      }
      goto LAB_0016ebf8;
    }
    load_s_smparams(this);
  }
  else {
    load_s_smparams_new(this,pxVar2);
    bVar1 = xr_reader::eof(pxVar2);
    if (!bVar1) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3ac,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
LAB_0016ebf8:
    xr_reader::close_chunk(r,&s);
  }
  s = xr_reader::open_chunk(r,0x1a);
  if (s == (xr_reader *)0x0) {
    s = xr_reader::open_chunk(r,0xe);
    if (s == (xr_reader *)0x0) {
      __assert_fail("s != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3c0,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
    load_s_motions(this,s);
    bVar1 = xr_reader::eof(s);
    if (!bVar1) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3c2,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
  }
  else {
    load_s_motions_new(this,s);
    bVar1 = xr_reader::eof(s);
    if (!bVar1) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3bc,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
  }
LAB_0016ec80:
  xr_reader::close_chunk(r,&s);
  return;
}

Assistant:

void xr_ogf_v3::load_kinematics_animated(xr_reader& r) {
	load_kinematics(r);
	xr_reader* s = r.open_chunk(OGF3_S_MOTION_REFS);
	if (s) {
		load_s_motion_refs(*s);
		r.close_chunk(s);
	} else {
		s = r.open_chunk(OGF3_S_SMPARAMS_NEW);
		if (s) {
			load_s_smparams_new(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_SMPARAMS);
			if (s) {
				load_s_smparams(*s);
				xr_assert(s->eof());
				r.close_chunk(s);
			} else {
				load_s_smparams();
			}
		}

		s = r.open_chunk(OGF3_S_MOTIONS_NEW);
		if (s) {
			load_s_motions_new(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_MOTIONS);
			xr_assert(s != 0);
			load_s_motions(*s);
			assert(s->eof());
			r.close_chunk(s);
		}
	}
}